

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O1

int SSE16x8_C(uint8_t *a,uint8_t *b)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  int iVar14;
  long lVar15;
  int y;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  short sVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  
  y = 0;
  iVar16 = 0;
  do {
    iVar17 = 0;
    iVar18 = 0;
    iVar19 = 0;
    lVar15 = 0;
    do {
      uVar1 = *(undefined4 *)(a + lVar15);
      uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar8;
      auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar3[8] = (char)((uint)uVar1 >> 0x10);
      auVar3._0_8_ = uVar8;
      auVar3[9] = 0;
      auVar3._10_3_ = auVar2._10_3_;
      auVar10._5_8_ = 0;
      auVar10._0_5_ = auVar3._8_5_;
      auVar4[4] = (char)((uint)uVar1 >> 8);
      auVar4._0_4_ = (int)uVar8;
      auVar4[5] = 0;
      auVar4._6_7_ = SUB137(auVar10 << 0x40,6);
      uVar1 = *(undefined4 *)(b + lVar15);
      uVar9 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar9;
      auVar5[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar6[8] = (char)((uint)uVar1 >> 0x10);
      auVar6._0_8_ = uVar9;
      auVar6[9] = 0;
      auVar6._10_3_ = auVar5._10_3_;
      auVar11._5_8_ = 0;
      auVar11._0_5_ = auVar6._8_5_;
      auVar7[4] = (char)((uint)uVar1 >> 8);
      auVar7._0_4_ = (int)uVar9;
      auVar7[5] = 0;
      auVar7._6_7_ = SUB137(auVar11 << 0x40,6);
      auVar20._0_4_ = (int)uVar8 - (int)uVar9;
      auVar20._4_4_ = auVar4._4_4_ - auVar7._4_4_;
      auVar20._8_4_ = auVar3._8_4_ - auVar6._8_4_;
      auVar20._12_4_ = (uint)(uint3)(auVar2._10_3_ >> 0x10) - (uint)(uint3)(auVar5._10_3_ >> 0x10);
      auVar20 = packssdw(auVar20,auVar20);
      auVar22 = pmulhw(auVar20,auVar20);
      sVar21 = auVar20._6_2_ * auVar20._6_2_;
      iVar14 = CONCAT22(auVar22._6_2_,sVar21);
      Var13 = CONCAT64(CONCAT42(iVar14,auVar22._4_2_),CONCAT22(auVar20._4_2_ * auVar20._4_2_,sVar21)
                      );
      auVar12._4_8_ = (long)((unkuint10)Var13 >> 0x10);
      auVar12._2_2_ = auVar22._2_2_;
      auVar12._0_2_ = auVar20._2_2_ * auVar20._2_2_;
      iVar16 = iVar16 + CONCAT22(auVar22._0_2_,auVar20._0_2_ * auVar20._0_2_);
      iVar17 = iVar17 + auVar12._0_4_;
      iVar18 = iVar18 + (int)((unkuint10)Var13 >> 0x10);
      iVar19 = iVar19 + iVar14;
      lVar15 = lVar15 + 4;
    } while (lVar15 != 0x10);
    iVar16 = iVar19 + iVar17 + iVar18 + iVar16;
    a = a + 0x20;
    b = b + 0x20;
    y = y + 1;
  } while (y != 8);
  return iVar16;
}

Assistant:

static int SSE16x8_C(const uint8_t* WEBP_RESTRICT a,
                     const uint8_t* WEBP_RESTRICT b) {
  return GetSSE(a, b, 16, 8);
}